

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O2

void absl::lts_20240722::AppendCordToString(Cord *src,Nonnull<std::string_*> dst)

{
  size_type sVar1;
  size_t sVar2;
  
  sVar1 = dst->_M_string_length;
  sVar2 = Cord::InlineRep::size(&src->contents_);
  strings_internal::STLStringResizeUninitializedAmortized<std::__cxx11::string>(dst,sVar2 + sVar1);
  Cord::CopyToArrayImpl(src,(dst->_M_dataplus)._M_p + sVar1);
  return;
}

Assistant:

void AppendCordToString(const Cord& src, absl::Nonnull<std::string*> dst) {
  const size_t cur_dst_size = dst->size();
  const size_t new_dst_size = cur_dst_size + src.size();
  absl::strings_internal::STLStringResizeUninitializedAmortized(dst,
                                                                new_dst_size);
  char* append_ptr = &(*dst)[cur_dst_size];
  src.CopyToArrayImpl(append_ptr);
}